

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcPreStatesPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  int stateCountModFour;
  int matrixIncr;
  double *matrices2_local;
  double *partials2_local;
  double *matrices1_local;
  int *states1_local;
  double *destP_local;
  BeagleCPUImpl<double,_1,_1> *this_local;
  
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPreStatesPartialsFixedScaling(REALTYPE* destP,
                                                                       const int* states1,
                                                                       const REALTYPE* matrices1,
                                                                       const REALTYPE* partials2,
                                                                       const REALTYPE* matrices2,
                                                                       const REALTYPE* scaleFactors,
                                                                       int startPattern,
                                                                       int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
//
//#pragma omp parallel for num_threads(kCategoryCount)
//    for (int l = 0; l < kCategoryCount; l++) {
//        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
//        int matrixOffset = l*kMatrixSize;
//        const REALTYPE* partials2Ptr = &partials2[v];
//        REALTYPE* destPtr = &destP[v];
//        for (int k = startPattern; k < endPattern; k++) {
//            int w = l * kMatrixSize;
//            int state1 = states1[k];
//            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
//            for (int i = 0; i < kStateCount; i++) {
//                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
//                REALTYPE tmp = matrices1[w + state1];
//                REALTYPE sumA = 0.0;
//                REALTYPE sumB = 0.0;
//                int j = 0;
//                for (; j < stateCountModFour; j += 4) {
//                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
//                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
//                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
//                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
//                }
//                for (; j < kStateCount; j++) {
//                    sumA += matrices2Ptr[j] * partials2Ptr[j];
//                }
//
//                w += matrixIncr;
//
//                *(destPtr++) = tmp * (sumA + sumB) * oneOverScaleFactor;
//            }
//            destPtr += P_PAD;
//            partials2Ptr += kPartialsPaddedStateCount;
//        }
//    }
}